

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# termination_test.c
# Opt level: O0

void init_term_test(int converter,double src_ratio)

{
  uint uVar1;
  int error_00;
  char *pcVar2;
  long lVar3;
  double dVar4;
  double local_78;
  int terminate;
  int error;
  int output_len;
  int input_len;
  int k;
  SRC_DATA src_data;
  double src_ratio_local;
  int converter_local;
  
  src_data.src_ratio = src_ratio;
  printf("\tinit_term_test   (SRC ratio = %7.4f) .......... ",src_ratio);
  fflush(_stdout);
  if (src_data.src_ratio < 1.0) {
    error = 0x800;
    dVar4 = floor(src_data.src_ratio * 2048.0);
    terminate = (int)dVar4;
  }
  else {
    terminate = 0x800;
    dVar4 = floor(2048.0 / src_data.src_ratio);
    error = (int)dVar4;
  }
  uVar1 = error - 10;
  for (output_len = 0; output_len < 0x800; output_len = output_len + 1) {
    init_term_test::input[output_len] = 1.0;
  }
  if (0x800 < terminate) {
    printf("\n\nLine %d : output_len > SHORT_BUFFER_LEN\n\n",0x85);
    exit(1);
  }
  _input_len = init_term_test::input;
  src_data.data_out = (float *)(long)(int)uVar1;
  src_data._48_8_ = src_data.src_ratio;
  src_data.data_in = init_term_test::output;
  src_data.input_frames = 0x800;
  error_00 = src_simple((SRC_DATA *)&input_len,converter,1);
  if (error_00 != 0) {
    pcVar2 = src_strerror(error_00);
    printf("\n\nLine %d : %s\n\n",0x92,pcVar2);
    exit(1);
  }
  if (src_data.src_ratio < 1.0) {
    local_78 = 1.0 / src_data.src_ratio;
  }
  else {
    local_78 = 1.0;
  }
  dVar4 = ceil(local_78);
  if ((double)(int)dVar4 <
      ABS(src_data.src_ratio * (double)(int)uVar1 + -(double)src_data.input_frames_used)) {
    printf("\n\nLine %d : Bad output frame count.\n\n",0x99);
    printf("\tterminate             : %d\n",(ulong)(uint)(int)dVar4);
    printf("\tsrc_ratio             : %.4f\n",src_data.src_ratio);
    printf("\tinput_len             : %d\n\tinput_len * src_ratio : %f\n",
           (double)(int)uVar1 * src_data.src_ratio,(ulong)uVar1);
    printf("\toutput_frames_gen     : %ld\n\n",src_data.input_frames_used);
    exit(1);
  }
  lVar3 = src_data.output_frames - (int)uVar1;
  if (lVar3 < 1) {
    lVar3 = -lVar3;
  }
  if (1 < lVar3) {
    printf("\n\nLine %d : input_frames_used should be %d, is %ld.\n\n",0xa4,(ulong)uVar1,
           src_data.output_frames);
    printf("\tsrc_ratio  : %.4f\n",src_data.src_ratio);
    printf("\tinput_len  : %d\n\tinput_used : %ld\n\n",(ulong)uVar1,src_data.output_frames);
    exit(1);
  }
  if (ABS(init_term_test::output[0]) < 0.1) {
    printf("\n\nLine %d : First output sample is bad.\n\n",0xab);
    printf("\toutput [0] == %f\n\n",(double)init_term_test::output[0]);
    exit(1);
  }
  puts("ok");
  return;
}

Assistant:

static void
init_term_test (int converter, double src_ratio)
{	static float input [SHORT_BUFFER_LEN], output [SHORT_BUFFER_LEN] ;

	SRC_DATA	src_data ;

	int k, input_len, output_len, error, terminate ;

	printf ("\tinit_term_test   (SRC ratio = %7.4f) .......... ", src_ratio) ;
	fflush (stdout) ;

	/* Calculate maximun input and output lengths. */
	if (src_ratio >= 1.0)
	{	output_len = SHORT_BUFFER_LEN ;
		input_len = (int) floor (SHORT_BUFFER_LEN / src_ratio) ;
		}
	else
	{	input_len = SHORT_BUFFER_LEN ;
		output_len = (int) floor (SHORT_BUFFER_LEN * src_ratio) ;
		} ;

	/* Reduce input_len by 10 so output is longer than necessary. */
	input_len -= 10 ;

	for (k = 0 ; k < ARRAY_LEN (input) ; k++)
		input [k] = 1.0 ;

	if (output_len > SHORT_BUFFER_LEN)
	{	printf ("\n\nLine %d : output_len > SHORT_BUFFER_LEN\n\n", __LINE__) ;
		exit (1) ;
		} ;

	src_data.data_in = input ;
	src_data.input_frames = input_len ;

	src_data.src_ratio = src_ratio ;

	src_data.data_out = output ;
	src_data.output_frames = SHORT_BUFFER_LEN ;

	if ((error = src_simple (&src_data, converter, 1)))
	{	printf ("\n\nLine %d : %s\n\n", __LINE__, src_strerror (error)) ;
		exit (1) ;
		} ;

	terminate = (int) ceil ((src_ratio >= 1.0) ? 1 : 1.0 / src_ratio) ;

	if (fabs (src_ratio * input_len - src_data.output_frames_gen) > terminate)
	{	printf ("\n\nLine %d : Bad output frame count.\n\n", __LINE__) ;
		printf ("\tterminate             : %d\n", terminate) ;
		printf ("\tsrc_ratio             : %.4f\n", src_ratio) ;
		printf ("\tinput_len             : %d\n"
				"\tinput_len * src_ratio : %f\n", input_len, input_len * src_ratio) ;
		printf ("\toutput_frames_gen     : %ld\n\n", src_data.output_frames_gen) ;
		exit (1) ;
		} ;

	if (labs (src_data.input_frames_used - input_len) > 1)
	{	printf ("\n\nLine %d : input_frames_used should be %d, is %ld.\n\n",
					 __LINE__, input_len, src_data.input_frames_used) ;
		printf ("\tsrc_ratio  : %.4f\n", src_ratio) ;
		printf ("\tinput_len  : %d\n\tinput_used : %ld\n\n", input_len, src_data.input_frames_used) ;
		exit (1) ;
		} ;

	if (fabs (output [0]) < 0.1)
	{	printf ("\n\nLine %d : First output sample is bad.\n\n", __LINE__) ;
		printf ("\toutput [0] == %f\n\n", output [0]) ;
		exit (1) ;
		}

	puts ("ok") ;

	return ;
}